

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ControlledLifetimeResource.h
# Opt level: O2

void Rml::ReleaseTextures(RenderInterface *match_render_interface)

{
  pointer ppVar1;
  CoreData *pCVar2;
  pair<Rml::RenderInterface_*,_std::unique_ptr<Rml::RenderManager,_std::default_delete<Rml::RenderManager>_>_>
  *render_manager;
  pointer ppVar3;
  
  if (core_data._8_8_ != 0) {
    pCVar2 = ControlledLifetimeResource<Rml::CoreData>::operator->
                       ((ControlledLifetimeResource<Rml::CoreData> *)core_data);
    ppVar1 = (pCVar2->render_managers).m_container.
             super__Vector_base<std::pair<Rml::RenderInterface_*,_std::unique_ptr<Rml::RenderManager,_std::default_delete<Rml::RenderManager>_>_>,_std::allocator<std::pair<Rml::RenderInterface_*,_std::unique_ptr<Rml::RenderManager,_std::default_delete<Rml::RenderManager>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (ppVar3 = (pCVar2->render_managers).m_container.
                  super__Vector_base<std::pair<Rml::RenderInterface_*,_std::unique_ptr<Rml::RenderManager,_std::default_delete<Rml::RenderManager>_>_>,_std::allocator<std::pair<Rml::RenderInterface_*,_std::unique_ptr<Rml::RenderManager,_std::default_delete<Rml::RenderManager>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppVar3 != ppVar1; ppVar3 = ppVar3 + 1)
    {
      if ((match_render_interface == (RenderInterface *)0x0) ||
         (ppVar3->first == match_render_interface)) {
        RenderManagerAccess::ReleaseAllTextures
                  ((ppVar3->second)._M_t.
                   super___uniq_ptr_impl<Rml::RenderManager,_std::default_delete<Rml::RenderManager>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Rml::RenderManager_*,_std::default_delete<Rml::RenderManager>_>
                   .super__Head_base<0UL,_Rml::RenderManager_*,_false>._M_head_impl);
      }
    }
  }
  return;
}

Assistant:

explicit operator bool() const noexcept { return pointer != nullptr; }